

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

void cmFortranParser_RuleInclude(cmFortranParser *parser,char *name)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  undefined1 local_58 [8];
  string fullName;
  string dir;
  char *name_local;
  cmFortranParser *parser_local;
  
  if (parser->InPPFalseBranch == 0) {
    bVar1 = std::stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_>::
            empty(&parser->FileStack);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!parser->FileStack.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFortranParserImpl.cxx"
                    ,0xf3,"void cmFortranParser_RuleInclude(cmFortranParser *, const char *)");
    }
    pvVar2 = std::stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_>::
             top(&parser->FileStack);
    std::__cxx11::string::string
              ((string *)(fullName.field_2._M_local_buf + 8),(string *)&pvVar2->Directory);
    std::__cxx11::string::string((string *)local_58);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmFortranParser_s::FindIncludeFile(parser,pcVar3,name,(string *)local_58);
    if (bVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&parser->Info->Includes,(value_type *)local_58);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmFortranParser_FilePush(parser,pcVar3);
    }
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)(fullName.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmFortranParser_RuleInclude(cmFortranParser* parser, const char* name)
{
  if (parser->InPPFalseBranch) {
    return;
  }

  // If processing an include statement there must be an open file.
  assert(!parser->FileStack.empty());

  // Get the directory containing the source in which the include
  // statement appears.  This is always the first search location for
  // Fortran include files.
  std::string dir = parser->FileStack.top().Directory;

  // Find the included file.  If it cannot be found just ignore the
  // problem because either the source will not compile or the user
  // does not care about depending on this included source.
  std::string fullName;
  if (parser->FindIncludeFile(dir.c_str(), name, fullName)) {
    // Found the included file.  Save it in the set of included files.
    parser->Info.Includes.insert(fullName);

    // Parse it immediately to translate the source inline.
    cmFortranParser_FilePush(parser, fullName.c_str());
  }
}